

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  cmState *pcVar5;
  char *pcVar6;
  bool local_18b;
  bool local_173;
  bool local_159;
  undefined1 local_128 [8];
  string notfound;
  undefined1 local_100 [8];
  string library;
  string local_d8;
  byte local_b3;
  byte local_b2;
  allocator local_b1;
  string local_b0;
  byte local_8b;
  byte local_8a;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *customLib;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsIn_local;
  cmFindLibraryCommand *this_local;
  
  customLib = &param_2->ReturnInvoked;
  param_2_local = (cmExecutionStatus *)argsIn;
  argsIn_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).VariableDocumentation,"Path to a library.");
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,"LIBRARY");
  uVar3 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand._vptr_cmCommand[7])
                    (this,param_2_local);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else if (((this->super_cmFindBase).AlreadyInCache & 1U) == 0) {
    pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,"CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX",&local_51);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_30 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      bVar2 = cmMakefile::PlatformIs32Bit
                        ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      local_8a = 0;
      local_8b = 0;
      local_159 = false;
      if (bVar2) {
        pcVar5 = cmMakefile::GetState
                           ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
        std::allocator<char>::allocator();
        local_8a = 1;
        std::__cxx11::string::string((string *)&local_88,"FIND_LIBRARY_USE_LIB32_PATHS",&local_89);
        local_8b = 1;
        local_159 = cmState::GetGlobalPropertyAsBool(pcVar5,&local_88);
      }
      if ((local_8b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_88);
      }
      if ((local_8a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      if (local_159 == false) {
        bVar2 = cmMakefile::PlatformIs64Bit
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
        local_b2 = 0;
        local_b3 = 0;
        local_173 = false;
        if (bVar2) {
          pcVar5 = cmMakefile::GetState
                             ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
          std::allocator<char>::allocator();
          local_b2 = 1;
          std::__cxx11::string::string((string *)&local_b0,"FIND_LIBRARY_USE_LIB64_PATHS",&local_b1)
          ;
          local_b3 = 1;
          local_173 = cmState::GetGlobalPropertyAsBool(pcVar5,&local_b0);
        }
        if ((local_b3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b0);
        }
        if ((local_b2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        }
        if (local_173 == false) {
          bVar2 = cmMakefile::PlatformIsx32
                            ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
          library.field_2._M_local_buf[0xe] = '\0';
          library.field_2._M_local_buf[0xd] = '\0';
          local_18b = false;
          if (bVar2) {
            pcVar5 = cmMakefile::GetState
                               ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile
                               );
            std::allocator<char>::allocator();
            library.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string
                      ((string *)&local_d8,"FIND_LIBRARY_USE_LIBX32_PATHS",
                       (allocator *)(library.field_2._M_local_buf + 0xf));
            library.field_2._M_local_buf[0xd] = '\x01';
            local_18b = cmState::GetGlobalPropertyAsBool(pcVar5,&local_d8);
          }
          if ((library.field_2._M_local_buf[0xd] & 1U) != 0) {
            std::__cxx11::string::~string((string *)&local_d8);
          }
          if ((library.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)(library.field_2._M_local_buf + 0xf));
          }
          if (local_18b != false) {
            AddArchitecturePaths(this,"x32");
          }
        }
        else {
          AddArchitecturePaths(this,"64");
        }
      }
      else {
        AddArchitecturePaths(this,"32");
      }
    }
    else {
      AddArchitecturePaths(this,pcVar4);
    }
    FindLibrary_abi_cxx11_((string *)local_100,this);
    bVar2 = std::operator!=((string *)local_100,"");
    if (bVar2) {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,pcVar4,pcVar6,FILEPATH,false);
      this_local._7_1_ = 1;
      notfound.field_2._12_4_ = 1;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     &(this->super_cmFindBase).VariableName,"-NOTFOUND");
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,pcVar4,pcVar6,FILEPATH,false);
      this_local._7_1_ = 1;
      notfound.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_128);
    }
    std::__cxx11::string::~string((string *)local_100);
  }
  else {
    if (((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo & 1U) != 0) {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,"",pcVar4,FILEPATH,false);
    }
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindLibraryCommand::InitialPass(std::vector<std::string> const& argsIn,
                                       cmExecutionStatus&)
{
  this->VariableDocumentation = "Path to a library.";
  this->CMakePathName = "LIBRARY";
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  if (this->AlreadyInCache) {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->AlreadyInCacheWithoutMetaInfo) {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmStateEnums::FILEPATH);
    }
    return true;
  }

  // add custom lib<qual> paths instead of using fixed lib32, lib64 or
  // libx32
  if (const char* customLib = this->Makefile->GetDefinition(
        "CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX")) {
    this->AddArchitecturePaths(customLib);
  }
  // add special 32 bit paths if this is a 32 bit compile.
  else if (this->Makefile->PlatformIs32Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB32_PATHS")) {
    this->AddArchitecturePaths("32");
  }
  // add special 64 bit paths if this is a 64 bit compile.
  else if (this->Makefile->PlatformIs64Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB64_PATHS")) {
    this->AddArchitecturePaths("64");
  }
  // add special 32 bit paths if this is an x32 compile.
  else if (this->Makefile->PlatformIsx32() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIBX32_PATHS")) {
    this->AddArchitecturePaths("x32");
  }

  std::string library = this->FindLibrary();
  if (library != "") {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName, library.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmStateEnums::FILEPATH);
    return true;
  }
  std::string notfound = this->VariableName + "-NOTFOUND";
  this->Makefile->AddCacheDefinition(this->VariableName, notfound.c_str(),
                                     this->VariableDocumentation.c_str(),
                                     cmStateEnums::FILEPATH);
  return true;
}